

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O3

uint8_t * IpmiFruAddCustomString(uint8_t *pos,char *key,char *value)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  
  sVar2 = strlen(key);
  sVar3 = strlen(value);
  iVar4 = (int)sVar2;
  iVar1 = (int)sVar3;
  if ((iVar4 < 0x3f) && (iVar4 != 0 || iVar1 != 0)) {
    iVar5 = 0x3e - iVar4;
    if (iVar4 + iVar1 + 1 < 0x40) {
      iVar5 = iVar1;
    }
    *pos = (char)sVar2 + (char)iVar5 + 0xc1;
    sVar2 = (size_t)iVar4;
    memcpy(pos + 1,key,sVar2);
    (pos + sVar2 + 2)[-1] = '=';
    memcpy(pos + sVar2 + 2,value,(long)iVar5);
    pos = pos + (long)iVar5 + sVar2 + 2;
  }
  return pos;
}

Assistant:

uint8_t *IpmiFruAddCustomString(uint8_t *pos, const char *key, const char *value)
{
    int len1 = strlen(key);
    int len2 = strlen(value);
    if ((len1 == 0 && len2 == 0) || len1 + 1 > 63) {
        return pos;
    }
    if (len1 + 1 + len2 > 63) {
        len2 = 63 - len1 - 1;
    }
    *pos++ = 0xC0 + len1 + 1 + len2;
    memcpy(pos, key, len1);
    pos += len1;
    *pos++ = (uint8_t)'=';
    memcpy(pos, value, len2);
    pos += len2;
    return pos;
}